

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreePrevious(BtCursor *pCur,int flags)

{
  MemPage *pMVar1;
  byte bVar2;
  u32 newPgno;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)flags;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (((pCur->eState == '\x01') && (pCur->ix != 0)) && (pCur->apPage[pCur->iPage]->leaf != '\0')) {
    pCur->ix = pCur->ix - 1;
    return 0;
  }
  bVar2 = pCur->eState;
  if (bVar2 != 1) {
    if (2 < bVar2) {
      iVar3 = btreeRestoreCursorPosition(pCur);
      if (iVar3 != 0) {
        return iVar3;
      }
      bVar2 = pCur->eState;
    }
    if (bVar2 == 0) {
      return 0x65;
    }
    iVar3 = pCur->skipNext;
    if (iVar3 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar3 < 0) {
        return 0;
      }
    }
  }
  pMVar1 = pCur->apPage[pCur->iPage];
  if (pMVar1->leaf == '\0') {
    newPgno = sqlite3Get4byte(pMVar1->aData +
                              (CONCAT11(pMVar1->aCellIdx[(ulong)pCur->ix * 2],
                                        pMVar1->aCellIdx[(ulong)pCur->ix * 2 + 1]) &
                              pMVar1->maskPage));
    iVar3 = moveToChild(pCur,newPgno);
    if (iVar3 == 0) {
      iVar3 = moveToRightmost(pCur);
      return iVar3;
    }
  }
  else {
    while (pCur->ix == 0) {
      if (pCur->iPage == '\0') {
        pCur->eState = '\0';
        return 0x65;
      }
      moveToParent(pCur);
    }
    pCur->ix = pCur->ix - 1;
    iVar3 = 0;
    if ((pCur->apPage[pCur->iPage]->intKey != '\0') &&
       (iVar3 = 0, pCur->apPage[pCur->iPage]->leaf == '\0')) {
      iVar3 = sqlite3BtreePrevious(pCur,(int)uVar4);
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int flags){
  assert( cursorOwnsBtShared(pCur) );
  assert( flags==0 || flags==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  UNUSED_PARAMETER( flags );  /* Used in COMDB2 but not native SQLite */
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->ix==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur);
  }
  pCur->ix--;
  return SQLITE_OK;
}